

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+
          (TPZSFMatrix<long_double> *__return_storage_ptr__,TPZSFMatrix<long_double> *this,
          longdouble value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longdouble *plVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  TPZSFMatrix(__return_storage_ptr__,CONCAT44(extraout_var,iVar1));
  plVar4 = __return_storage_ptr__->fElem;
  plVar3 = this->fElem;
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  plVar2 = plVar3 + CONCAT44(extraout_var_00,iVar1);
  for (; plVar3 < plVar2; plVar3 = plVar3 + 1) {
    *plVar4 = *plVar3 + value;
    plVar4 = plVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSFMatrix<TVar> 
TPZSFMatrix<TVar> ::operator+(const TVar value ) const
{
	TPZSFMatrix<TVar>  res( this->Dim() );
	
	TVar *dst = res.fElem;
	TVar *src = fElem;
	TVar *end = &fElem[ Size() ];
	while ( src < end )
		*dst++ = (*src++) + value;
	
	return( res );
}